

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

double sse_to_psnr(double samples,double peak,double sse)

{
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double psnr;
  double local_30;
  double local_8;
  
  if (in_XMM2_Qa <= 0.0) {
    local_8 = 100.0;
  }
  else {
    local_30 = log10((in_XMM0_Qa * in_XMM1_Qa * in_XMM1_Qa) / in_XMM2_Qa);
    local_30 = local_30 * 10.0;
    if (100.0 < local_30) {
      local_30 = 100.0;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

double sse_to_psnr(double samples, double peak, double sse) {
  static const double kMaxPSNR = 100.0;

  if (sse > 0.0) {
    const double psnr = 10.0 * log10(samples * peak * peak / sse);
    return psnr > kMaxPSNR ? kMaxPSNR : psnr;
  } else {
    return kMaxPSNR;
  }
}